

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall
QCss::ValueExtractor::extractFont(ValueExtractor *this,QFont *font,int *fontSizeAdjustment)

{
  QVariant *pQVar1;
  Property PVar2;
  DeclarationData *pDVar3;
  Value *pVVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int i;
  Capitalization caps;
  ulong uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  Value local_90;
  undefined1 local_68 [8];
  anon_union_24_3_e3d07ef4_for_data aStack_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fontExtracted == 0) {
    if ((this->declarations).d.size == 0) {
      QFont::operator=(&this->f,font);
      this->adjustment = *fontSizeAdjustment;
      iVar6 = 2;
      bVar12 = false;
    }
    else {
      uVar8 = 0;
      iVar6 = 0;
      do {
        pDVar3 = (this->declarations).d.ptr[uVar8].d.d.ptr;
        if ((pDVar3->values).d.size == 0) goto switchD_005dc738_caseD_65;
        pVVar4 = (pDVar3->values).d.ptr;
        PVar2 = pDVar3->propertyId;
        if (PVar2 - Font < 5) {
          switch(PVar2) {
          case Font:
            iVar6 = 0;
            QFont::setStyle(font,StyleNormal);
            QFont::setWeight(font,Normal);
            *fontSizeAdjustment = -0xff;
            if ((pDVar3->values).d.size == 0) {
              uVar11 = 0;
            }
            else {
              lVar9 = 0;
              uVar10 = 0;
              do {
                bVar12 = setFontStyleFromValue
                                   ((Value *)((long)&((pDVar3->values).d.ptr)->type + lVar9),font);
                if ((!bVar12) &&
                   (bVar12 = setFontWeightFromValue
                                       ((Value *)((long)&((pDVar3->values).d.ptr)->type + lVar9),
                                        font), !bVar12)) {
                  uVar11 = (pDVar3->values).d.size;
                  break;
                }
                uVar10 = uVar10 + 1;
                uVar11 = (pDVar3->values).d.size;
                lVar9 = lVar9 + 0x28;
              } while (uVar10 < uVar11);
              if (uVar10 < uVar11) {
                pQVar1 = &(pDVar3->values).d.ptr[uVar10].variant;
                local_68._0_4_ = *(undefined4 *)((long)(pQVar1 + -1) + 0x18);
                ::QVariant::QVariant((QVariant *)&aStack_60,pQVar1);
                setFontSizeFromValue((Value *)local_68,font,fontSizeAdjustment);
                ::QVariant::~QVariant((QVariant *)&aStack_60);
                uVar10 = (ulong)((int)uVar10 + 1);
                uVar11 = (pDVar3->values).d.size;
              }
              iVar6 = (int)uVar10;
            }
            if ((long)iVar6 < (long)uVar11) {
              setFontFamilyFromValues(&pDVar3->values,font,iVar6);
            }
LAB_005dcb8a:
            iVar6 = 1;
            goto switchD_005dc738_caseD_65;
          case FontFamily:
            setFontFamilyFromValues(&pDVar3->values,font,0);
            break;
          case FontSize:
            local_90.type = pVVar4->type;
            ::QVariant::QVariant(&local_90.variant,&pVVar4->variant);
            setFontSizeFromValue(&local_90,font,fontSizeAdjustment);
            ::QVariant::~QVariant(&local_90.variant);
            break;
          case FontStyle:
            setFontStyleFromValue(pVVar4,font);
            break;
          case FontWeight:
            setFontWeightFromValue(pVVar4,font);
          }
          goto LAB_005dcaf0;
        }
        switch(PVar2) {
        case FontVariant:
          iVar6 = 1;
          if (pVVar4->type == KnownIdentifier) {
            caps = MixedCase;
            iVar6 = ::QVariant::toInt((bool *)&pVVar4->variant);
            if (iVar6 != 1) {
              if (iVar6 != 0x31) goto LAB_005dcb8a;
              caps = SmallCaps;
            }
LAB_005dcb7f:
            QFont::setCapitalization(font,caps);
            goto LAB_005dcb8a;
          }
          break;
        case TextTransform:
          iVar6 = 1;
          if (pVVar4->type == KnownIdentifier) {
            caps = MixedCase;
            iVar6 = ::QVariant::toInt((bool *)&pVVar4->variant);
            if (iVar6 != 0x27) {
              if (iVar6 == 0x33) {
                caps = AllLowercase;
              }
              else {
                if (iVar6 != 0x32) goto LAB_005dcb8a;
                caps = AllUppercase;
              }
            }
            goto LAB_005dcb7f;
          }
          break;
        case QtListNumberPrefix:
        case QtListNumberSuffix:
        case LineHeight:
        case QtLineHeightType:
        case QtForegroundTextureCacheKey:
        case QtIcon:
          break;
        case FontKerning:
          iVar6 = 1;
          if (pVVar4->type == KnownIdentifier) {
            iVar7 = ::QVariant::toInt((bool *)&pVVar4->variant);
            if (iVar7 == 0x27) {
              bVar12 = false;
            }
            else {
              if (iVar7 != 1) break;
              bVar12 = true;
            }
            QFont::setKerning(font,bVar12);
          }
          break;
        case LetterSpacing:
          aStack_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          aStack_60.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          ::QVariant::toString();
          QVar13.m_data = (char *)0x2;
          QVar13.m_size = (qsizetype)local_68;
          cVar5 = QString::endsWith(QVar13,0x6ca21f);
          if (cVar5 == '\0') {
            QVar15.m_data = (char *)0x2;
            QVar15.m_size = (qsizetype)local_68;
            cVar5 = QString::endsWith(QVar15,0x6a6120);
            if (cVar5 != '\0') {
              QString::chop((longlong)local_68);
              QString::toDouble((bool *)local_68);
            }
          }
          else {
            QString::chop((longlong)local_68);
            QString::toDouble((bool *)local_68);
          }
          goto LAB_005dcacd;
        case WordSpacing:
          aStack_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          aStack_60.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          ::QVariant::toString();
          QVar14.m_data = (char *)0x2;
          QVar14.m_size = (qsizetype)local_68;
          cVar5 = QString::endsWith(QVar14,0x6a6120);
          if (cVar5 != '\0') {
            QString::chop((longlong)local_68);
            QString::toDouble((bool *)local_68);
          }
LAB_005dcacd:
          if (local_68 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_68,2,0x10);
            }
          }
LAB_005dcaf0:
          iVar6 = 1;
          break;
        default:
          if (PVar2 == TextDecoration) {
            lVar9 = 8;
            uVar11 = 0;
            do {
              pVVar4 = (pDVar3->values).d.ptr;
              if (*(int *)((long)pVVar4 + lVar9 + -8) == 6) {
                iVar6 = ::QVariant::toInt((bool *)((long)&pVVar4->type + lVar9));
                if (iVar6 < 0x10) {
                  if (iVar6 == 0xe) {
                    QFont::setUnderline(font,true);
                  }
                  else if (iVar6 == 0xf) {
                    QFont::setOverline(font,true);
                  }
                }
                else {
                  if (iVar6 == 0x10) {
                    bVar12 = true;
                  }
                  else {
                    if (iVar6 != 0x27) goto LAB_005dc88a;
                    QFont::setUnderline(font,false);
                    QFont::setOverline(font,false);
                    bVar12 = false;
                  }
                  QFont::setStrikeOut(font,bVar12);
                }
              }
LAB_005dc88a:
              uVar11 = uVar11 + 1;
              lVar9 = lVar9 + 0x28;
            } while (uVar11 < (ulong)(pDVar3->values).d.size);
            goto LAB_005dcb8a;
          }
        }
switchD_005dc738_caseD_65:
        bVar12 = SUB41(iVar6,0);
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)(this->declarations).d.size);
      QFont::operator=(&this->f,font);
      this->adjustment = *fontSizeAdjustment;
      iVar6 = 2 - iVar6;
    }
    this->fontExtracted = iVar6;
  }
  else {
    QFont::operator=(font,&this->f);
    *fontSizeAdjustment = this->adjustment;
    bVar12 = this->fontExtracted == 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar12;
  }
  __stack_chk_fail();
}

Assistant:

bool ValueExtractor::extractFont(QFont *font, int *fontSizeAdjustment)
{
    if (fontExtracted) {
        *font = f;
        *fontSizeAdjustment = adjustment;
        return fontExtracted == 1;
    }

    bool hit = false;
    for (int i = 0; i < declarations.size(); ++i) {
        const Declaration &decl = declarations.at(i);
        if (decl.d->values.isEmpty())
            continue;
        const QCss::Value &val = decl.d->values.at(0);
        switch (decl.d->propertyId) {
            case FontSize: setFontSizeFromValue(val, font, fontSizeAdjustment); break;
            case FontStyle: setFontStyleFromValue(val, font); break;
            case FontWeight: setFontWeightFromValue(val, font); break;
            case FontFamily: setFontFamilyFromValues(decl.d->values, font); break;
            case FontKerning: setFontKerningFromValue(val, font); break;
            case TextDecoration: setTextDecorationFromValues(decl.d->values, font); break;
            case Font: parseShorthandFontProperty(decl.d->values, font, fontSizeAdjustment); break;
            case FontVariant: setFontVariantFromValue(val, font); break;
            case TextTransform: setTextTransformFromValue(val, font); break;
            case LetterSpacing: setLetterSpacingFromValue(val, font); break;
            case WordSpacing: setWordSpacingFromValue(val, font); break;
            default: continue;
        }
        hit = true;
    }

    f = *font;
    adjustment = *fontSizeAdjustment;
    fontExtracted = hit ? 1 : 2;
    return hit;
}